

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void cmovno_(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if (((((pMyDisasm->Reserved_).EVEX.state == '\x01') ||
       ((pMyDisasm->Reserved_).VEX.state != '\x01')) || ((pMyDisasm->Reserved_).VEX.L != '\x01')) ||
     (((int)(uint)(pMyDisasm->Reserved_).VEX.vvvv >> 3 & 1U) != 1)) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Instruction).Category = 0x10001;
      strcpy((pMyDisasm->Instruction).Mnemonic,"cmovno");
      GvEv(pMyDisasm);
      FillFlags(pMyDisasm,0x13);
    }
  }
  else {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
      if ((pMyDisasm->Reserved_).MOD_ == 3) {
        if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
          if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
            (pMyDisasm->Instruction).Category = 0x140000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"kandb");
            (pMyDisasm->Reserved_).Register_ = 0x400;
            GyEy(pMyDisasm);
          }
          else if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
            (pMyDisasm->Instruction).Category = 0x140000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"kandw");
            (pMyDisasm->Reserved_).Register_ = 0x400;
            GyEy(pMyDisasm);
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
          (pMyDisasm->Instruction).Category = 0x140000;
          strcpy((pMyDisasm->Instruction).Mnemonic,"kandd");
          (pMyDisasm->Reserved_).Register_ = 0x400;
          GyEy(pMyDisasm);
        }
        else if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
          (pMyDisasm->Instruction).Category = 0x140000;
          strcpy((pMyDisasm->Instruction).Mnemonic,"kandq");
          (pMyDisasm->Reserved_).Register_ = 0x400;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
  }
  return;
}

Assistant:

void __bea_callspec__ cmovno_(PDISASM pMyDisasm)
{

  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 1) &&
      (((GV.VEX.vvvv >> 3) & 0x1) == 1)
    ) {
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_ == 0x3) {
      if (GV.REX.W_ == 0) {
        if (GV.VEX.pp == 1) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandb");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else if (GV.VEX.pp == 0) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandw");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        if (GV.VEX.pp == 1) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandd");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else if (GV.VEX.pp == 0) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kandq");
          #endif
          GV.Register_ = OPMASK_REG;
          GyEy(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cmovno");
    #endif
    GvEv(pMyDisasm);
    FillFlags(pMyDisasm, 19);
  }
  else {
    failDecode(pMyDisasm);
  }
}